

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pixel.cpp
# Opt level: O2

void __thiscall Pixel_d::print(Pixel_d *this,ostream *os)

{
  ostream *poVar1;
  
  std::operator<<(os,"Pixel[");
  poVar1 = std::ostream::_M_insert<double>(this->x);
  std::operator<<(poVar1,',');
  poVar1 = std::ostream::_M_insert<double>(this->y);
  std::operator<<(poVar1,"](");
  poVar1 = std::ostream::_M_insert<double>((this->color).super_Matx<double,_3,_1>.val[0]);
  std::operator<<(poVar1,',');
  poVar1 = std::ostream::_M_insert<double>((this->color).super_Matx<double,_3,_1>.val[1]);
  std::operator<<(poVar1,',');
  poVar1 = std::ostream::_M_insert<double>((this->color).super_Matx<double,_3,_1>.val[2]);
  std::operator<<(poVar1,')');
  return;
}

Assistant:

void Pixel_d::print(std::ostream& os) const
{
  os << "Pixel[" << (double)x << ',' << (double)y << "]("
     << color[0] << ','
     << color[1] << ','
     << color[2] << ')';
}